

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_cache.hpp
# Opt level: O3

bool __thiscall
cappuccino::tlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::insert
          (tlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1> *this,
          milliseconds ttl,unsigned_long *key,unsigned_long value,allow a)

{
  bool bVar1;
  int iVar2;
  time_point now;
  undefined8 uVar3;
  unsigned_long local_38;
  
  local_38 = value;
  now.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    bVar1 = do_insert_update(this,key,&local_38,now,
                             (time_point)(ttl.__r * 1000000 + (long)now.__d.__r),a);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return bVar1;
  }
  uVar3 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  _Unwind_Resume(uVar3);
}

Assistant:

auto insert(std::chrono::milliseconds ttl, const key_type& key, value_type value, allow a = allow::insert_or_update)
        -> bool
    {
        auto now         = std::chrono::steady_clock::now();
        auto expire_time = now + ttl;

        std::lock_guard guard{m_lock};
        return do_insert_update(key, std::move(value), now, expire_time, a);
    }